

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O1

void serialization::
     unserialize_helper<serialization::json_iarchive,std::vector<int,std::allocator<int>>>
               (json_iarchive *ar,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *v)

{
  size_type sVar1;
  size_type sVar2;
  size_type i;
  size_type i_00;
  vector<int,_std::allocator<int>_> tmp;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_38;
  
  sVar1 = json_iarchive::load_sequence_start(ar);
  local_38 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              *)v;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::reserve(v,(ulong)sVar1);
  if (sVar1 != 0) {
    i_00 = 0;
    do {
      json_iarchive::load_sequence_item_start(ar,i_00);
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      sVar2 = json_iarchive::load_sequence_start(ar);
      std::vector<int,_std::allocator<int>_>::reserve(&local_58,(ulong)sVar2);
      if (sVar2 != 0) {
        i = 0;
        do {
          json_iarchive::load_sequence_item_start(ar,i);
          json_iarchive::load(ar,&local_5c);
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_5c;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          json_iarchive::load_sequence_item_end(ar);
          i = i + 1;
        } while (sVar2 != i);
      }
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>(local_38,&local_58);
      json_iarchive::load_sequence_item_end(ar);
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      i_00 = i_00 + 1;
    } while (i_00 != sVar1);
  }
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}